

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Input.cxx
# Opt level: O0

void __thiscall Fl_File_Input::draw_buttons(Fl_File_Input *this)

{
  short sVar1;
  byte bVar2;
  int iVar3;
  Fl_Boxtype FVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Fl_Boxtype local_74;
  Fl_Boxtype local_60;
  Fl_Boxtype local_48;
  Fl_Boxtype local_2c;
  int local_18;
  int local_14;
  int X;
  int i;
  Fl_File_Input *this_local;
  
  bVar2 = Fl_Widget::damage((Fl_Widget *)this);
  if ((bVar2 & 0x90) != 0) {
    update_buttons(this);
  }
  local_18 = 0;
  for (local_14 = 0; this->buttons_[local_14] != 0; local_14 = local_14 + 1) {
    sVar1 = this->buttons_[local_14];
    iVar3 = Fl_Input_::xscroll((Fl_Input_ *)this);
    if (iVar3 < local_18 + sVar1) {
      iVar3 = Fl_Input_::xscroll((Fl_Input_ *)this);
      if (local_18 < iVar3) {
        if (this->pressed_ == local_14) {
          FVar4 = down_box(this);
          local_2c = fl_down(FVar4);
        }
        else {
          local_2c = down_box(this);
        }
        iVar3 = Fl_Widget::x((Fl_Widget *)this);
        iVar5 = Fl_Widget::y((Fl_Widget *)this);
        sVar1 = this->buttons_[local_14];
        iVar6 = Fl_Input_::xscroll((Fl_Input_ *)this);
        Fl_Widget::draw_box((Fl_Widget *)this,local_2c,iVar3,iVar5,(local_18 + sVar1) - iVar6,10,
                            0x31);
      }
      else {
        sVar1 = this->buttons_[local_14];
        iVar3 = Fl_Input_::xscroll((Fl_Input_ *)this);
        iVar5 = Fl_Widget::w((Fl_Widget *)this);
        if (iVar5 < (local_18 + sVar1) - iVar3) {
          if (this->pressed_ == local_14) {
            FVar4 = down_box(this);
            local_48 = fl_down(FVar4);
          }
          else {
            local_48 = down_box(this);
          }
          iVar3 = Fl_Widget::x((Fl_Widget *)this);
          iVar5 = Fl_Input_::xscroll((Fl_Input_ *)this);
          iVar6 = Fl_Widget::y((Fl_Widget *)this);
          iVar7 = Fl_Widget::w((Fl_Widget *)this);
          iVar8 = Fl_Input_::xscroll((Fl_Input_ *)this);
          Fl_Widget::draw_box((Fl_Widget *)this,local_48,(iVar3 + local_18) - iVar5,iVar6,
                              (iVar7 - local_18) + iVar8,10,0x31);
        }
        else {
          if (this->pressed_ == local_14) {
            FVar4 = down_box(this);
            local_60 = fl_down(FVar4);
          }
          else {
            local_60 = down_box(this);
          }
          iVar3 = Fl_Widget::x((Fl_Widget *)this);
          iVar5 = Fl_Input_::xscroll((Fl_Input_ *)this);
          iVar6 = Fl_Widget::y((Fl_Widget *)this);
          Fl_Widget::draw_box((Fl_Widget *)this,local_60,(iVar3 + local_18) - iVar5,iVar6,
                              (int)this->buttons_[local_14],10,0x31);
        }
      }
    }
    local_18 = this->buttons_[local_14] + local_18;
  }
  iVar3 = Fl_Widget::w((Fl_Widget *)this);
  if (local_18 < iVar3) {
    if (this->pressed_ == local_14) {
      FVar4 = down_box(this);
      local_74 = fl_down(FVar4);
    }
    else {
      local_74 = down_box(this);
    }
    iVar3 = Fl_Widget::x((Fl_Widget *)this);
    iVar5 = Fl_Input_::xscroll((Fl_Input_ *)this);
    iVar6 = Fl_Widget::y((Fl_Widget *)this);
    iVar7 = Fl_Widget::w((Fl_Widget *)this);
    iVar8 = Fl_Input_::xscroll((Fl_Input_ *)this);
    Fl_Widget::draw_box((Fl_Widget *)this,local_74,(iVar3 + local_18) - iVar5,iVar6,
                        (iVar7 - local_18) + iVar8,10,0x31);
  }
  return;
}

Assistant:

void Fl_File_Input::draw_buttons() {
  int	i,					// Looping var
	X;					// Current X position


  if (damage() & (FL_DAMAGE_BAR | FL_DAMAGE_ALL)) {
    update_buttons();
  }

  for (X = 0, i = 0; buttons_[i]; i ++)
  {
    if ((X + buttons_[i]) > xscroll()) {
      if (X < xscroll()) {
        draw_box(pressed_ == i ? fl_down(down_box()) : down_box(),
                 x(), y(), X + buttons_[i] - xscroll(), DIR_HEIGHT, FL_GRAY);
      } else if ((X + buttons_[i] - xscroll()) > w()) {
	draw_box(pressed_ == i ? fl_down(down_box()) : down_box(),
        	 x() + X - xscroll(), y(), w() - X + xscroll(), DIR_HEIGHT,
		 FL_GRAY);
      } else {
        draw_box(pressed_ == i ? fl_down(down_box()) : down_box(),
	         x() + X - xscroll(), y(), buttons_[i], DIR_HEIGHT, FL_GRAY);
      }
    }

    X += buttons_[i];
  }

  if (X < w()) {
    draw_box(pressed_ == i ? fl_down(down_box()) : down_box(),
             x() + X - xscroll(), y(), w() - X + xscroll(), DIR_HEIGHT, FL_GRAY);
  }
}